

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O1

void __thiscall
spvtools::opt::MergeReturnPass::CreatePhiNodesForInst
          (MergeReturnPass *this,BasicBlock *merge_block,Instruction *inst)

{
  _Rb_tree_color _Var1;
  IRContext *pIVar2;
  DefUseManager *pDVar3;
  CFG *this_00;
  iterator instr;
  pointer pOVar4;
  uint **ppuVar5;
  mapped_type pBVar6;
  undefined8 uVar7;
  char cVar8;
  uint32_t uVar9;
  BasicBlock *pBVar10;
  mapped_type *pmVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  Instruction *pIVar12;
  mapped_type *ppBVar13;
  _Base_ptr p_Var14;
  uint **ppuVar15;
  _Base_ptr p_Var16;
  Operand *operand;
  spv_ext_inst_table psVar17;
  pointer pOVar18;
  Operand *operand_1;
  _Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false> _Var19;
  _Rb_tree_header *p_Var20;
  bool bVar21;
  uint32_t pred_id;
  uint32_t undef_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> phi_operands;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  regen_inst;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  users_to_update;
  DominatorAnalysis *dom_tree;
  vector<unsigned_int,_std::allocator<unsigned_int>_> preds;
  mapped_type local_100;
  _Any_data local_f8;
  iterator local_e8;
  iterator *piStack_e0;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_d8;
  uint32_t local_d0;
  uint32_t local_cc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_a8;
  Instruction *local_a0;
  undefined1 local_98 [40];
  spv_ext_inst_table psStack_70;
  _Head_base<0UL,_spvtools::opt::Module_*,_false> local_68;
  _Any_data local_60;
  Instruction *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_100 = merge_block;
  local_60._M_unused._M_object =
       IRContext::GetDominatorAnalysis
                 ((this->super_MemPass).super_Pass.context_,merge_block->function_);
  if (inst->has_result_id_ != true) {
    return;
  }
  uVar9 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
  if (uVar9 == 0) {
    return;
  }
  pBVar10 = IRContext::get_instr_block((this->super_MemPass).super_Pass.context_,inst);
  local_98._32_8_ = (spv_ext_inst_table)0x0;
  psStack_70 = (spv_ext_inst_table)0x0;
  local_68._M_head_impl = (Module *)0x0;
  pIVar2 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar2);
  }
  pDVar3 = (pIVar2->def_use_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  local_e8.node_ = (Instruction *)0x0;
  piStack_e0 = (iterator *)0x0;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = (BasicBlock *)0x0;
  local_f8._M_unused._M_object = operator_new(0x28);
  ((IRContext *)local_f8._M_unused._0_8_)->syntax_context_ = (spv_context)(local_98 + 0x20);
  *(_Any_data **)&((IRContext *)local_f8._M_unused._0_8_)->grammar_ = &local_60;
  (((IRContext *)local_f8._M_unused._0_8_)->grammar_).operandTable_ = (spv_operand_table)inst;
  (((IRContext *)local_f8._M_unused._0_8_)->grammar_).opcodeTable_ = (spv_opcode_table)pBVar10;
  (((IRContext *)local_f8._M_unused._0_8_)->grammar_).extInstTable_ = (spv_ext_inst_table)this;
  piStack_e0 = (iterator *)
               std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp:281:9)>
               ::_M_invoke;
  local_e8.node_ =
       (Instruction *)
       std::
       _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp:281:9)>
       ::_M_manager;
  analysis::DefUseManager::ForEachUser
            (pDVar3,inst,(function<void_(spvtools::opt::Instruction_*)> *)&local_f8);
  if (local_e8.node_ != (Instruction *)0x0) {
    (*(code *)local_e8.node_)(&local_f8,&local_f8,3);
  }
  if ((spv_ext_inst_table)local_98._32_8_ == psStack_70) goto LAB_00262dfe;
  uVar9 = 0;
  if (inst->has_type_id_ == true) {
    uVar9 = Instruction::GetSingleWordOperand(inst,0);
  }
  local_cc = MemPass::Type2Undef(&this->super_MemPass,uVar9);
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  pmVar11 = std::__detail::
            _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->new_edges_,&local_100);
  pIVar2 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar2);
  }
  this_00 = (pIVar2->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  pIVar12 = (local_100->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar9 = 0;
  if (pIVar12->has_result_id_ == true) {
    uVar9 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
  }
  __x = CFG::preds(this_00,uVar9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,__x);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    p_Var20 = &(pmVar11->_M_t)._M_impl.super__Rb_tree_header;
    _Var19._M_head_impl =
         (DefUseManager *)
         local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    do {
      _Var1 = *(_Rb_tree_color *)&((_Var19._M_head_impl)->id_to_def_)._M_h._M_buckets;
      local_f8._0_4_ = _Var1;
      p_Var16 = (pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var14 = &p_Var20->_M_header;
      for (; (_Rb_tree_header *)p_Var16 != (_Rb_tree_header *)0x0;
          p_Var16 = (&p_Var16->_M_left)[bVar21]) {
        bVar21 = (_Rb_tree_color)*(size_t *)(p_Var16 + 1) < _Var1;
        if (!bVar21) {
          p_Var14 = p_Var16;
        }
      }
      p_Var16 = &p_Var20->_M_header;
      if (((_Rb_tree_header *)p_Var14 != p_Var20) &&
         (p_Var16 = p_Var14, _Var1 < p_Var14[1]._M_color)) {
        p_Var16 = &p_Var20->_M_header;
      }
      if ((_Rb_tree_header *)p_Var16 == p_Var20) {
        uVar9 = 0;
        if (inst->has_result_id_ == true) {
          uVar9 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
        }
        local_98._0_4_ = uVar9;
        if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_00262afe;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_c8,
                   (iterator)
                   local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(uint *)local_98);
      }
      else {
        uVar9 = local_cc;
        if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_c8,
                     (iterator)
                     local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_cc);
        }
        else {
LAB_00262afe:
          *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = uVar9;
          local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_c8,
                   (iterator)
                   local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(uint *)local_f8._M_pod_data);
      }
      else {
        *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = local_f8._0_4_;
        local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      _Var19._M_head_impl =
           (DefUseManager *)((long)&((_Var19._M_head_impl)->id_to_def_)._M_h._M_buckets + 4);
    } while (_Var19._M_head_impl !=
             (DefUseManager *)
             local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  pIVar2 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar2);
  }
  pDVar3 = (pIVar2->def_use_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  uVar9 = 0;
  if (inst->has_type_id_ == true) {
    uVar9 = Instruction::GetSingleWordOperand(inst,0);
  }
  pIVar12 = analysis::DefUseManager::GetDef(pDVar3,uVar9);
  if (pIVar12->opcode_ == OpTypePointer) {
    pIVar2 = (this->super_MemPass).super_Pass.context_;
    if ((pIVar2->feature_mgr_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
        .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl ==
        (FeatureManager *)0x0) {
      IRContext::AnalyzeFeatures(pIVar2);
    }
    bVar21 = EnumSet<spv::Capability>::contains
                       (&((pIVar2->feature_mgr_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                          .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>.
                         _M_head_impl)->capabilities_,VariablePointers);
    uVar9 = (pIVar12->has_result_id_ & 1) + 1;
    if (pIVar12->has_type_id_ == false) {
      uVar9 = (uint)pIVar12->has_result_id_;
    }
    uVar9 = Instruction::GetSingleWordOperand(pIVar12,uVar9);
    if ((bVar21) && ((uVar9 & 0xfffffff7) == 4)) goto LAB_00262bfd;
    local_a8._M_head_impl = Instruction::Clone(inst,(this->super_MemPass).super_Pass.context_);
    uVar9 = Pass::TakeNextId((Pass *)this);
    if ((local_a8._M_head_impl)->has_result_id_ == false) {
      __assert_fail("has_result_id_",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                    ,0x2c8,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
    }
    if (uVar9 == 0) {
      __assert_fail("res_id != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                    ,0x2cd,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
    }
    piStack_e0 = &local_e8;
    local_f8._M_unused._M_object = &PTR__SmallVector_003e9b28;
    local_d8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_e8.node_._0_4_ = uVar9;
    local_f8._8_8_ = 1;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)
               ((long)&((OperandData *)
                       (((((local_a8._M_head_impl)->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_start)->words).buffer + -4))->
                       _vptr_SmallVector +
               (ulong)((uint)(local_a8._M_head_impl)->has_type_id_ * 0x30)),
               (SmallVector<unsigned_int,_2UL> *)&local_f8);
    local_f8._M_unused._M_object = &PTR__SmallVector_003e9b28;
    if (local_d8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_d8,local_d8._M_head_impl);
    }
    pIVar12 = (local_100->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
              super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    while (pIVar12->opcode_ == OpPhi) {
      pIVar12 = (pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if ((pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar12 = (Instruction *)0x0;
      }
    }
    pIVar12 = Instruction::InsertBefore
                        (pIVar12,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                  *)&local_a8);
    pIVar2 = (this->super_MemPass).super_Pass.context_;
    if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar2);
    }
    analysis::DefUseManager::AnalyzeInstDefUse
              ((pIVar2->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               pIVar12);
    pBVar6 = local_100;
    pIVar2 = (this->super_MemPass).super_Pass.context_;
    local_f8._M_unused._0_8_ = (undefined8)pIVar12;
    if ((pIVar2->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
      ppBVar13 = std::__detail::
                 _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&pIVar2->instr_to_block_,(key_type *)&local_f8);
      *ppBVar13 = pBVar6;
    }
    uVar7 = local_60._M_unused._0_8_;
    pBVar6 = local_100;
    local_98._0_8_ = (spv_context)0x0;
    local_98._8_8_ = 0;
    local_98._16_8_ = (spv_operand_table)0x0;
    local_98._24_8_ = (spv_opcode_table)0x0;
    local_98._0_8_ = operator_new(0x18);
    (((Instruction *)local_98._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    _vptr_IntrusiveNodeBase = (_func_int **)uVar7;
    (((Instruction *)local_98._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    next_node_ = (Instruction *)pBVar6;
    (((Instruction *)local_98._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    previous_node_ = (Instruction *)this;
    local_98._24_8_ =
         std::
         _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp:358:28)>
         ::_M_invoke;
    local_98._16_8_ =
         std::
         _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp:358:28)>
         ::_M_manager;
    local_f8._8_8_ = (BasicBlock *)0x0;
    piStack_e0 = (iterator *)
                 std::
                 _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:830:17)>
                 ::_M_invoke;
    local_e8.node_ =
         (Instruction *)
         std::
         _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:830:17)>
         ::_M_manager;
    pOVar18 = (pIVar12->operands_).
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pOVar4 = (pIVar12->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_f8._M_unused._M_object = (IRContext *)local_98;
    if (pOVar18 != pOVar4) {
      do {
        bVar21 = spvIsInIdType(pOVar18->type);
        if (bVar21) {
          ppuVar5 = (uint **)(pOVar18->words).large_data_._M_t.
                             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                             ._M_head_impl;
          ppuVar15 = &(pOVar18->words).small_data_;
          if (ppuVar5 != (uint **)0x0) {
            ppuVar15 = ppuVar5;
          }
          local_a0 = (Instruction *)*ppuVar15;
          if (local_e8.node_ == (Instruction *)0x0) {
LAB_00263063:
            std::__throw_bad_function_call();
          }
          cVar8 = (*(code *)piStack_e0)(&local_f8,&local_a0);
          if (cVar8 == '\0') break;
        }
        pOVar18 = pOVar18 + 1;
      } while (pOVar18 != pOVar4);
    }
    if (local_e8.node_ != (Instruction *)0x0) {
      (*(code *)local_e8.node_)(&local_f8,&local_f8,3);
    }
    if ((spv_operand_table)local_98._16_8_ != (spv_operand_table)0x0) {
      (*(code *)local_98._16_8_)(local_98,local_98,3);
    }
    if (local_a8._M_head_impl != (Instruction *)0x0) {
      (*((local_a8._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase[1])();
    }
  }
  else {
LAB_00262bfd:
    pIVar2 = (this->super_MemPass).super_Pass.context_;
    instr.node_ = (local_100->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                  super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    local_f8._8_8_ = IRContext::get_instr_block(pIVar2,instr.node_);
    piStack_e0 = (iterator *)CONCAT44(piStack_e0._4_4_,3);
    uVar9 = 0;
    local_f8._M_unused._M_object = pIVar2;
    local_e8.node_ = instr.node_;
    if (inst->has_type_id_ == true) {
      uVar9 = Instruction::GetSingleWordOperand(inst,0);
    }
    pIVar12 = InstructionBuilder::AddPhi((InstructionBuilder *)&local_f8,uVar9,&local_c8,0);
  }
  local_d0 = 0;
  local_50 = inst;
  if (pIVar12->has_result_id_ == true) {
    local_d0 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
  }
  local_60._8_8_ = psStack_70;
  if ((spv_ext_inst_table)local_98._32_8_ != psStack_70) {
    psVar17 = (spv_ext_inst_table)local_98._32_8_;
    do {
      pIVar12 = *(Instruction **)psVar17;
      local_98._0_8_ = local_50;
      local_98._12_4_ = 0;
      local_98._8_4_ = local_d0;
      local_98._24_8_ =
           std::
           _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp:375:25)>
           ::_M_invoke;
      local_98._16_8_ =
           std::
           _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp:375:25)>
           ::_M_manager;
      local_f8._8_8_ = (BasicBlock *)0x0;
      local_f8._M_unused._M_object = local_98;
      piStack_e0 = (iterator *)
                   std::
                   _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:830:17)>
                   ::_M_invoke;
      local_e8.node_ =
           (Instruction *)
           std::
           _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:830:17)>
           ::_M_manager;
      pOVar4 = (pIVar12->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pOVar18 = (pIVar12->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start; pOVar18 != pOVar4;
          pOVar18 = pOVar18 + 1) {
        bVar21 = spvIsInIdType(pOVar18->type);
        if (bVar21) {
          ppuVar5 = (uint **)(pOVar18->words).large_data_._M_t.
                             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                             ._M_head_impl;
          ppuVar15 = &(pOVar18->words).small_data_;
          if (ppuVar5 != (uint **)0x0) {
            ppuVar15 = ppuVar5;
          }
          local_a0 = (Instruction *)*ppuVar15;
          if (local_e8.node_ == (Instruction *)0x0) goto LAB_00263063;
          cVar8 = (*(code *)piStack_e0)(&local_f8,&local_a0);
          if (cVar8 == '\0') break;
        }
      }
      if (local_e8.node_ != (Instruction *)0x0) {
        (*(code *)local_e8.node_)(&local_f8,&local_f8,3);
      }
      if ((spv_operand_table)local_98._16_8_ != (spv_operand_table)0x0) {
        (*(code *)local_98._16_8_)(local_98,local_98,3);
      }
      IRContext::AnalyzeUses((this->super_MemPass).super_Pass.context_,pIVar12);
      psVar17 = (spv_ext_inst_table)&psVar17->groups;
    } while (psVar17 != (spv_ext_inst_table)local_60._8_8_);
  }
  if ((DefUseManager *)
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (DefUseManager *)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_00262dfe:
  if ((spv_ext_inst_table)local_98._32_8_ != (spv_ext_inst_table)0x0) {
    operator_delete((void *)local_98._32_8_,(long)local_68._M_head_impl - local_98._32_8_);
  }
  return;
}

Assistant:

void MergeReturnPass::CreatePhiNodesForInst(BasicBlock* merge_block,
                                            Instruction& inst) {
  DominatorAnalysis* dom_tree =
      context()->GetDominatorAnalysis(merge_block->GetParent());

  if (inst.result_id() != 0) {
    BasicBlock* inst_bb = context()->get_instr_block(&inst);
    std::vector<Instruction*> users_to_update;
    context()->get_def_use_mgr()->ForEachUser(
        &inst,
        [&users_to_update, &dom_tree, &inst, inst_bb, this](Instruction* user) {
          BasicBlock* user_bb = nullptr;
          if (user->opcode() != spv::Op::OpPhi) {
            user_bb = context()->get_instr_block(user);
          } else {
            // For OpPhi, the use should be considered to be in the predecessor.
            for (uint32_t i = 0; i < user->NumInOperands(); i += 2) {
              if (user->GetSingleWordInOperand(i) == inst.result_id()) {
                uint32_t user_bb_id = user->GetSingleWordInOperand(i + 1);
                user_bb = context()->get_instr_block(user_bb_id);
                break;
              }
            }
          }

          // If |user_bb| is nullptr, then |user| is not in the function.  It is
          // something like an OpName or decoration, which should not be
          // replaced with the result of the OpPhi.
          if (user_bb && !dom_tree->Dominates(inst_bb, user_bb)) {
            users_to_update.push_back(user);
          }
        });

    if (users_to_update.empty()) {
      return;
    }

    // There is at least one values that needs to be replaced.
    // First create the OpPhi instruction.
    uint32_t undef_id = Type2Undef(inst.type_id());
    std::vector<uint32_t> phi_operands;
    const std::set<uint32_t>& new_edges = new_edges_[merge_block];

    // Add the OpPhi operands. If the predecessor is a return block use undef,
    // otherwise use |inst|'s id.
    std::vector<uint32_t> preds = cfg()->preds(merge_block->id());
    for (uint32_t pred_id : preds) {
      if (new_edges.count(pred_id)) {
        phi_operands.push_back(undef_id);
      } else {
        phi_operands.push_back(inst.result_id());
      }
      phi_operands.push_back(pred_id);
    }

    Instruction* new_phi = nullptr;
    // If the instruction is a pointer and variable pointers are not an option,
    // then we have to regenerate the instruction instead of creating an OpPhi
    // instruction.  If not, the Spir-V will be invalid.
    Instruction* inst_type = get_def_use_mgr()->GetDef(inst.type_id());
    bool regenerateInstruction = false;
    if (inst_type->opcode() == spv::Op::OpTypePointer) {
      if (!context()->get_feature_mgr()->HasCapability(
              spv::Capability::VariablePointers)) {
        regenerateInstruction = true;
      }

      auto storage_class =
          spv::StorageClass(inst_type->GetSingleWordInOperand(0));
      if (storage_class != spv::StorageClass::Workgroup &&
          storage_class != spv::StorageClass::StorageBuffer) {
        regenerateInstruction = true;
      }
    }

    if (regenerateInstruction) {
      std::unique_ptr<Instruction> regen_inst(inst.Clone(context()));
      uint32_t new_id = TakeNextId();
      regen_inst->SetResultId(new_id);
      Instruction* insert_pos = &*merge_block->begin();
      while (insert_pos->opcode() == spv::Op::OpPhi) {
        insert_pos = insert_pos->NextNode();
      }
      new_phi = insert_pos->InsertBefore(std::move(regen_inst));
      get_def_use_mgr()->AnalyzeInstDefUse(new_phi);
      context()->set_instr_block(new_phi, merge_block);

      new_phi->ForEachInId([dom_tree, merge_block, this](uint32_t* use_id) {
        Instruction* use = get_def_use_mgr()->GetDef(*use_id);
        BasicBlock* use_bb = context()->get_instr_block(use);
        if (use_bb != nullptr && !dom_tree->Dominates(use_bb, merge_block)) {
          CreatePhiNodesForInst(merge_block, *use);
        }
      });
    } else {
      InstructionBuilder builder(
          context(), &*merge_block->begin(),
          IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
      new_phi = builder.AddPhi(inst.type_id(), phi_operands);
    }
    uint32_t result_of_phi = new_phi->result_id();

    // Update all of the users to use the result of the new OpPhi.
    for (Instruction* user : users_to_update) {
      user->ForEachInId([&inst, result_of_phi](uint32_t* id) {
        if (*id == inst.result_id()) {
          *id = result_of_phi;
        }
      });
      context()->AnalyzeUses(user);
    }
  }
}